

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O0

bool libtorrent::anon_unknown_6::send_peer(peer_connection *p)

{
  bool bVar1;
  uint uVar2;
  peer_connection *p_local;
  
  bVar1 = libtorrent::aux::peer_connection::is_outgoing(p);
  if ((!bVar1) && (bVar1 = libtorrent::aux::peer_connection::received_listen_port(p), !bVar1)) {
    return false;
  }
  bVar1 = libtorrent::aux::peer_connection::is_connecting(p);
  if (bVar1) {
    p_local._7_1_ = false;
  }
  else {
    uVar2 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])();
    if ((uVar2 & 1) == 0) {
      p_local._7_1_ = true;
    }
    else {
      p_local._7_1_ = false;
    }
  }
  return p_local._7_1_;
}

Assistant:

bool send_peer(aux::peer_connection const& p)
	{
		// don't send out those peers that we haven't connected to
		// (that have connected to us) and that aren't sharing their
		// listening port
		if (!p.is_outgoing() && !p.received_listen_port()) return false;
		// don't send out peers that we haven't successfully connected to
		if (p.is_connecting()) return false;
		if (p.in_handshake()) return false;
		return true;
	}